

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Select * __thiscall
wasm::Builder::makeSelect
          (Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse,Type type)

{
  Type TVar1;
  
  TVar1.id = (uintptr_t)MixedArena::alloc<wasm::Select>(&this->wasm->allocator);
  *(Expression **)(TVar1.id + 0x20) = condition;
  *(Expression **)(TVar1.id + 0x10) = ifTrue;
  *(Expression **)(TVar1.id + 0x18) = ifFalse;
  ::wasm::Select::finalize(TVar1);
  return (Select *)TVar1.id;
}

Assistant:

Select* makeSelect(Expression* condition,
                     Expression* ifTrue,
                     Expression* ifFalse,
                     Type type) {
    auto* ret = wasm.allocator.alloc<Select>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize(type);
    return ret;
  }